

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_lrzip.c
# Opt level: O0

void test_write_filter_lrzip(void)

{
  undefined8 uVar1;
  wchar_t wVar2;
  int iVar3;
  void *buff_00;
  void *__s;
  archive *paVar4;
  char *pcVar5;
  la_ssize_t lVar6;
  la_int64_t v2;
  uint local_5c;
  int i;
  size_t used2;
  size_t used1;
  char path [16];
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  archive *a;
  archive_entry *ae;
  
  wVar2 = canLrzip();
  if (wVar2 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                   ,L',');
    test_skipping("lrzip command-line program not found");
  }
  else {
    buff_00 = malloc(2000000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                     ,L'1',(uint)(buff_00 != (void *)0x0),"NULL != (buff = malloc(buffsize))",
                     (void *)0x0);
    path[8] = '\x10';
    path[9] = '\'';
    path[10] = '\0';
    path[0xb] = '\0';
    path[0xc] = '\0';
    path[0xd] = '\0';
    path[0xe] = '\0';
    path[0xf] = '\0';
    __s = malloc(10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                     ,L'4',(uint)(__s != (void *)0x0),"NULL != (data = malloc(datasize))",
                     (void *)0x0);
    memset(__s,0,path._8_8_);
    paVar4 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                     ,L':',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar3 = archive_write_set_format_gnutar(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L';',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_gnutar(a)",paVar4
                       );
    iVar3 = archive_write_add_filter_lrzip(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'<',-0x14,"ARCHIVE_WARN",(long)iVar3,"archive_write_add_filter_lrzip(a)",
                        paVar4);
    iVar3 = archive_write_set_bytes_per_block(paVar4,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'>',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_bytes_per_block(a, 10)",
                        paVar4);
    iVar3 = archive_filter_code(paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'?',10,"ARCHIVE_FILTER_LRZIP",(long)iVar3,"archive_filter_code(a, 0)",
                        (void *)0x0);
    pcVar5 = archive_filter_name(paVar4,0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
               ,L'@',"lrzip","\"lrzip\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
    iVar3 = archive_write_open_memory(paVar4,buff_00,2000000,&used2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'B',0,"ARCHIVE_OK",(long)iVar3,
                        "archive_write_open_memory(a, buff, buffsize, &used1)",paVar4);
    a = (archive *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                     ,L'C',(uint)((archive_entry *)a != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_filetype((archive_entry *)a,0x8000);
    archive_entry_set_size((archive_entry *)a,path._8_8_);
    for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
      snprintf((char *)&used1,0x10,"file%03d");
      archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
      iVar3 = archive_write_header(paVar4,(archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                          ,L'I',0,"ARCHIVE_OK",(long)iVar3,"archive_write_header(a, ae)",paVar4);
      uVar1 = path._8_8_;
      lVar6 = archive_write_data(paVar4,__s,path._8_8_);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                       ,L'K',(uint)(uVar1 == lVar6),
                       "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
    }
    archive_entry_free((archive_entry *)a);
    iVar3 = archive_write_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'N',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",paVar4);
    iVar3 = archive_write_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'O',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                     ,L'Q',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar3 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'R',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_format_all(a)",paVar4
                       );
    iVar3 = archive_read_support_filter_lrzip(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'S',-0x14,"ARCHIVE_WARN",(long)iVar3,
                        "archive_read_support_filter_lrzip(a)",paVar4);
    iVar3 = archive_read_open_memory(paVar4,buff_00,used2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'U',0,"ARCHIVE_OK",(long)iVar3,"archive_read_open_memory(a, buff, used1)",
                        paVar4);
    for (local_5c = 0; (int)local_5c < 100; local_5c = local_5c + 1) {
      snprintf((char *)&used1,0x10,"file%03d",(ulong)local_5c);
      iVar3 = archive_read_next_header(paVar4,(archive_entry **)&a);
      wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                                  ,L'Y',0,"ARCHIVE_OK",(long)iVar3,
                                  "archive_read_next_header(a, &ae)",(void *)0x0);
      if (wVar2 == L'\0') break;
      pcVar5 = archive_entry_pathname((archive_entry *)a);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                 ,L'[',(char *)&used1,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar3 = (int)path._8_8_;
      v2 = archive_entry_size((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                          ,L'\\',(long)iVar3,"(int)datasize",v2,"archive_entry_size(ae)",(void *)0x0
                         );
    }
    iVar3 = archive_filter_code(paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'^',10,"ARCHIVE_FILTER_LRZIP",(long)iVar3,"archive_filter_code(a, 0)",
                        (void *)0x0);
    pcVar5 = archive_filter_name(paVar4,0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
               ,L'_',"lrzip","\"lrzip\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
    iVar3 = archive_read_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'`',0,"ARCHIVE_OK",(long)iVar3,"archive_read_close(a)",paVar4);
    iVar3 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'a',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
    paVar4 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                     ,L'g',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar3 = archive_write_add_filter_lrzip(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'h',-0x14,"ARCHIVE_WARN",(long)iVar3,"archive_write_add_filter_lrzip(a)",
                        paVar4);
    iVar3 = archive_write_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'i',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
    paVar4 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                     ,L'k',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar3 = archive_write_add_filter_lrzip(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'l',-0x14,"ARCHIVE_WARN",(long)iVar3,"archive_write_add_filter_lrzip(a)",
                        paVar4);
    iVar3 = archive_write_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'm',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",(void *)0x0);
    iVar3 = archive_write_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'n',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
    paVar4 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                     ,L'p',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar3 = archive_write_set_format_ustar(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'q',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_ustar(a)",paVar4)
    ;
    iVar3 = archive_write_add_filter_lrzip(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'r',-0x14,"ARCHIVE_WARN",(long)iVar3,"archive_write_add_filter_lrzip(a)",
                        paVar4);
    iVar3 = archive_write_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L's',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",(void *)0x0);
    iVar3 = archive_write_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L't',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
    paVar4 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                     ,L'v',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar3 = archive_write_set_format_ustar(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'w',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_ustar(a)",paVar4)
    ;
    iVar3 = archive_write_add_filter_lrzip(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'x',-0x14,"ARCHIVE_WARN",(long)iVar3,"archive_write_add_filter_lrzip(a)",
                        paVar4);
    iVar3 = archive_write_open_memory(paVar4,buff_00,2000000,(size_t *)&stack0xffffffffffffffa8);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'z',0,"ARCHIVE_OK",(long)iVar3,
                        "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
    iVar3 = archive_write_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'{',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",(void *)0x0);
    iVar3 = archive_write_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_filter_lrzip.c"
                        ,L'|',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
    free(__s);
    free(buff_00);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_lrzip)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i;

	if (!canLrzip()) {
		skipping("lrzip command-line program not found");
		return;
	}

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));

	datasize = 10000;
	assert(NULL != (data = malloc(datasize)));
	memset(data, 0, datasize);

	/*
	 * Write 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_gnutar(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_LRZIP, archive_filter_code(a, 0));
	assertEqualString("lrzip", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_support_filter_lrzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used1));
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		if (!assertEqualInt(ARCHIVE_OK,
			archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualInt(ARCHIVE_FILTER_LRZIP, archive_filter_code(a, 0));
	assertEqualString("lrzip", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_WARN, archive_write_add_filter_lrzip(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}